

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O2

Vec_Int_t * Sdb_StoIterCuts(Sdb_Sto_t *p)

{
  bool bVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Vec_Wec_t *vCuts;
  Gia_Obj_t *pGVar6;
  Vec_Int_t *pVVar7;
  int iVar8;
  uint i;
  long lVar9;
  uint local_60;
  uint local_5c;
  int *pCut;
  Sdb_Sto_t *local_50;
  int local_44;
  Vec_Int_t *local_40;
  Vec_Wec_t *local_38;
  
  local_50 = p;
  vCuts = Vec_WecAlloc(100);
  iVar8 = 0;
  while ((iVar8 < local_50->pGia->nObjs &&
         (pGVar6 = Gia_ManObj(local_50->pGia,iVar8), pGVar6 != (Gia_Obj_t *)0x0))) {
    if (((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) &&
       (iVar3 = Sdb_StoIterCutsOne(local_50,iVar8,5,&pCut), piVar2 = pCut, iVar3 != 0)) {
      if (iVar3 != 1) {
        __assert_fail("RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acec2Mult.c"
                      ,0x41f,"Vec_Int_t *Sdb_StoIterCuts(Sdb_Sto_t *)");
      }
      if (*pCut != 5) {
        __assert_fail("pCut[0] == 5",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acec2Mult.c"
                      ,0x420,"Vec_Int_t *Sdb_StoIterCuts(Sdb_Sto_t *)");
      }
      pVVar7 = Vec_WecPushLevel(vCuts);
      for (lVar9 = 1; lVar9 <= *piVar2; lVar9 = lVar9 + 1) {
        Vec_IntPush(pVVar7,piVar2[lVar9]);
      }
    }
    iVar8 = iVar8 + 1;
  }
  local_44 = vCuts->nSize;
  iVar8 = 0;
  printf("Detected %d  5-cuts.\n");
  local_40 = Sdb_StoFindAll(vCuts);
  local_60 = 0xffffffff;
  bVar1 = false;
  local_5c = local_60;
  local_38 = vCuts;
  do {
    if ((local_50->pGia->nObjs <= iVar8) ||
       (pGVar6 = Gia_ManObj(local_50->pGia,iVar8), pGVar6 == (Gia_Obj_t *)0x0)) {
      Vec_IntFree(local_40);
      uVar4 = vCuts->nSize;
      if ((int)uVar4 < 1) {
        uVar4 = 0;
      }
      for (i = 0; i != uVar4; i = i + 1) {
        pVVar7 = Vec_WecEntry(vCuts,i);
        printf(" %4d : {",(ulong)i);
        for (iVar8 = 0; iVar8 < pVVar7->nSize; iVar8 = iVar8 + 1) {
          uVar5 = Vec_IntEntry(pVVar7,iVar8);
          printf(" %d",(ulong)uVar5);
        }
        puts(" }");
      }
      if (local_5c != 0) {
        printf("Front  = %d\n",(ulong)local_5c);
      }
      if (local_60 != 0) {
        printf("Back   = %d\n");
      }
      if (bVar1) {
        printf("Sign   = %d\n",1);
      }
      pVVar7 = Sdb_StoFindInputs(vCuts,local_5c);
      Vec_WecFree(vCuts);
      return pVVar7;
    }
    if (((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) &&
       (iVar3 = Sdb_StoIterCutsOne(local_50,iVar8,4,&pCut), piVar2 = pCut, iVar3 != 0)) {
      if (iVar3 == 1) {
        __assert_fail("RetValue >= 2 && RetValue <= 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acec2Mult.c"
                      ,0x42d,"Vec_Int_t *Sdb_StoIterCuts(Sdb_Sto_t *)");
      }
      if (*pCut != 4) {
        __assert_fail("pCut[0] == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acec2Mult.c"
                      ,0x42e,"Vec_Int_t *Sdb_StoIterCuts(Sdb_Sto_t *)");
      }
      uVar4 = Sdb_StoDiffExactlyOne(vCuts,local_44,pCut);
      if (uVar4 != 0xffffffff) {
        if (iVar3 == 2) {
          local_5c = uVar4;
        }
        pVVar7 = Vec_WecPushLevel(vCuts);
        Vec_IntPush(pVVar7,0);
        for (lVar9 = 1; lVar9 <= *piVar2; lVar9 = lVar9 + 1) {
          Vec_IntPush(pVVar7,piVar2[lVar9]);
        }
        if (iVar3 != 2) {
          local_60 = uVar4;
        }
        vCuts = local_38;
        if (iVar3 == 4) {
          bVar1 = true;
        }
      }
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Sdb_StoIterCuts( Sdb_Sto_t * p )
{
    Vec_Wec_t * v5Cuts = Vec_WecAlloc( 100 );
    Vec_Int_t * v5Cut, * vAll, * vRes;
    Gia_Obj_t * pObj;   
    int k, iObj, * pCut, Limit, iNew, iNewFront = -1, iNewBack = -1, iSigned = 0;
    Gia_ManForEachAnd( p->pGia, pObj, iObj )
    {
        int RetValue = Sdb_StoIterCutsOne( p, iObj, 5, &pCut );
        if ( RetValue == 0 )
            continue;
        assert( RetValue == 1 );
        assert( pCut[0] == 5 );
        v5Cut = Vec_WecPushLevel( v5Cuts );
        for ( k = 1; k <= pCut[0]; k++ )
            Vec_IntPush( v5Cut, pCut[k] );
    }
    Limit = Vec_WecSize( v5Cuts );
    printf( "Detected %d  5-cuts.\n", Vec_WecSize(v5Cuts) );
    vAll = Sdb_StoFindAll( v5Cuts );
    Gia_ManForEachAnd( p->pGia, pObj, iObj )
    {
        int RetValue = Sdb_StoIterCutsOne( p, iObj, 4, &pCut );
        if ( RetValue == 0 )
            continue;
        assert( RetValue >= 2 && RetValue <= 4 );
        assert( pCut[0] == 4 );
        // find cut, which differs in exactly one input
        iNew = Sdb_StoDiffExactlyOne( v5Cuts, Limit, pCut );
        if ( iNew == -1 )
            continue;
        if ( RetValue == 2 )
            iNewFront = iNew;
        else 
            iNewBack = iNew;
        if ( RetValue == 4 )
            iSigned = 1;
        // save in the second cut
        v5Cut = Vec_WecPushLevel( v5Cuts );
        Vec_IntPush( v5Cut, 0 );
        for ( k = 1; k <= pCut[0]; k++ )
            Vec_IntPush( v5Cut, pCut[k] );
    }
    Vec_IntFree( vAll );
    Vec_WecPrint( v5Cuts, 0 );

    if ( iNewFront )
        printf( "Front  = %d\n", iNewFront );
    if ( iNewBack )
        printf( "Back   = %d\n", iNewBack );
    if ( iSigned )
        printf( "Sign   = %d\n", iSigned );

    vRes = Sdb_StoFindInputs( v5Cuts, iNewFront );

    Vec_WecFree( v5Cuts );
    return vRes;
}